

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffsrow(fitsfile *infptr,fitsfile *outfptr,char *expr,int *status)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  fitsfile *fptr;
  int *in_RCX;
  long unaff_RBX;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_RSI;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_RDI;
  bool bVar6;
  iteratorCol *unaff_retaddr;
  int in_stack_00000008;
  int *in_stack_00000020;
  int i;
  LONGLONG j;
  LONGLONG offset;
  LONGLONG repeat;
  ParseData lParse;
  anon_struct_40_5_96c4ccfa outExt;
  anon_struct_40_5_96c4ccfa inExt;
  uchar result;
  uchar *buffer;
  long freespace;
  LONGLONG hsize;
  LONGLONG outbyteloc;
  LONGLONG inbyteloc;
  LONGLONG ntodo;
  long outloc;
  long inloc;
  long nGood;
  long nbuff;
  long maxrows;
  long naxes [5];
  long rdlen;
  long nelem;
  int constant;
  int naxis;
  parseInfo Info;
  int *in_stack_00001420;
  int in_stack_0000142c;
  long in_stack_00001430;
  fitsfile *in_stack_00001438;
  int *status_00;
  ParseData *lParse_00;
  uchar *values;
  int *keyname;
  fitsfile *in_stack_fffffffffffffd18;
  fitsfile *pfVar7;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  byte bVar8;
  undefined1 in_stack_fffffffffffffd27;
  fitsfile *length;
  LONGLONG in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  void *in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  fitsfile *in_stack_fffffffffffffd58;
  int *in_stack_fffffffffffffd60;
  fitsfile *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  fitsfile *in_stack_fffffffffffffd78;
  long *in_stack_fffffffffffffd80;
  fitsfile *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int *in_stack_fffffffffffffdc0;
  long *in_stack_fffffffffffffdc8;
  ParseData *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffe00;
  fitsfile *in_stack_fffffffffffffe08;
  fitsfile *local_1b8;
  fitsfile *status_01;
  fitsfile *fptr_00;
  fitsfile *local_190;
  long local_188;
  fitsfile *local_180;
  long local_178;
  long local_170;
  char local_161;
  void *local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  fitsfile *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  long local_120;
  fitsfile *local_118;
  fitsfile *local_110;
  undefined1 local_108 [56];
  Node *local_d0;
  uint local_c8;
  int local_c4;
  int local_c0 [2];
  void *local_b8;
  long local_b0;
  long local_a8;
  undefined1 *local_98;
  int *local_30;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*in_RCX == 0) {
    local_30 = in_RCX;
    memset(local_c0,0,0x90);
    memset(&local_190,0,0x28);
    memset(&local_1b8,0,0x28);
    lParse_00 = (ParseData *)local_108;
    status_00 = &local_c4;
    values = &stack0xfffffffffffffd60;
    keyname = local_30;
    iVar5 = ffiprs((fitsfile *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda4,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                   &in_stack_fffffffffffffd88->HDUposition,in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdd8);
    if (iVar5 == 0) {
      bVar6 = (long)local_d0 < 0;
      if (bVar6) {
        local_d0 = (Node *)-(long)local_d0;
      }
      local_c8 = (uint)bVar6;
      if ((local_c0[0] == 0xe) && (local_d0 == (Node *)0x1)) {
        if (*(int *)in_RDI != *(int *)(*(long *)(in_RDI + 8) + 0x54)) {
          ffmahd(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                 &in_stack_fffffffffffffd68->HDUposition,in_stack_fffffffffffffd60);
        }
        if (*local_30 == 0) {
          local_190 = *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3c8);
          local_188 = *(long *)(*(long *)(in_RDI + 8) + 0x3c0);
          local_180 = *(fitsfile **)(*(long *)(in_RDI + 8) + 0x3e0);
          if (local_188 == 0) {
            ffcprs(lParse_00);
            iVar5 = *local_30;
          }
          else {
            if (*(int *)in_RSI != *(int *)(*(long *)(in_RSI + 8) + 0x54)) {
              ffmahd(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                     &in_stack_fffffffffffffd68->HDUposition,in_stack_fffffffffffffd60);
            }
            if (*(long *)(*(long *)(in_RSI + 8) + 0x88) < 0) {
              ffrdef(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            }
            if (*local_30 == 0) {
              local_1b8 = *(fitsfile **)(*(long *)(in_RSI + 8) + 0x3c8);
              status_01 = *(fitsfile **)(*(long *)(in_RSI + 8) + 0x3c0);
              if (status_01 == (fitsfile *)0x0) {
                *(undefined8 *)(*(long *)(in_RSI + 8) + 0x3e0) = 0;
              }
              fptr_00 = *(fitsfile **)(*(long *)(in_RSI + 8) + 0x3e0);
              if (local_190 == local_1b8) {
                local_b8 = malloc(local_188 + 1);
                local_b0 = 0;
                local_a8 = local_188;
                local_98 = &stack0xfffffffffffffd60;
                if (local_b8 == (void *)0x0) {
                  ffpmsg((char *)0x12bbef);
                  ffcprs(lParse_00);
                  *local_30 = 0x71;
                  iVar5 = 0x71;
                }
                else {
                  *(undefined1 *)((long)local_b8 + local_188) = 0;
                  if (local_c8 == 0) {
                    status_00 = local_30;
                    ffiter(in_stack_00000008,unaff_retaddr,unaff_RBX,
                           CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,
                           in_RSI,in_stack_00000020);
                    local_120 = 0;
                    for (local_138 = (fitsfile *)0x0; (long)local_138 < local_188;
                        local_138 = (fitsfile *)((long)&local_138->HDUposition + 1)) {
                      if (*(char *)((long)local_b8 + (long)local_138) != '\0') {
                        local_120 = local_120 + 1;
                      }
                    }
                  }
                  else {
                    local_161 = in_stack_fffffffffffffd98
                                [(long)in_stack_fffffffffffffda8 * 0x180 + 0x80];
                    for (local_138 = (fitsfile *)0x0; (long)local_138 < local_188;
                        local_138 = (fitsfile *)((long)&local_138->HDUposition + 1)) {
                      *(char *)((long)local_b8 + (long)local_138) = local_161;
                    }
                    in_stack_fffffffffffffd38 = local_188;
                    local_120 = local_188;
                    if (local_161 == '\0') {
                      local_120 = 0;
                      in_stack_fffffffffffffd38 = local_120;
                    }
                  }
                  if (*local_30 == 0) {
                    local_108._48_8_ = local_190;
                    length = local_190;
                    if ((long)local_190 < 500000) {
                      length = (fitsfile *)0x7a120;
                    }
                    local_160 = malloc((size_t)length);
                    if (local_160 == (void *)0x0) {
                      ffcprs(lParse_00);
                      *local_30 = 0x71;
                      return 0x71;
                    }
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = SUB168(SEXT816(500000),8);
                    if (SUB168((auVar3 << 0x40 | ZEXT816(500000)) / SEXT816((long)local_108._48_8_),
                               0) < 2) {
                      fptr = (fitsfile *)0x1;
                    }
                    else {
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = SUB168(SEXT816(500000),8);
                      fptr = SUB168((auVar4 << 0x40 | ZEXT816(500000)) /
                                    SEXT816((long)local_108._48_8_),0);
                    }
                    local_118 = (fitsfile *)0x0;
                    local_128 = (undefined1 *)0x1;
                    local_110 = fptr;
                    if (in_RDI == in_RSI) {
                      for (; *(char *)((long)local_b8 + (long)(local_128 + -1)) != '\0';
                          local_128 = local_128 + 1) {
                      }
                      local_130 = local_128;
                    }
                    else {
                      local_130 = (undefined1 *)((long)&status_01->HDUposition + 1);
                      if (1 < (long)local_130) {
                        ffirow(in_stack_fffffffffffffd58,(LONGLONG)in_stack_fffffffffffffd50,
                               (LONGLONG)in_stack_fffffffffffffd48,
                               (int *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
                        ;
                      }
                    }
                    do {
                      if (*(char *)((long)local_b8 + (long)(local_128 + -1)) != '\0') {
                        ffgtbb(fptr,CONCAT17(in_stack_fffffffffffffd27,
                                             CONCAT16(in_stack_fffffffffffffd26,
                                                      in_stack_fffffffffffffd20)),
                               (LONGLONG)in_stack_fffffffffffffd18,(LONGLONG)keyname,values,
                               (int *)lParse_00);
                        local_118 = (fitsfile *)((long)&local_118->HDUposition + 1);
                        if (local_118 == local_110) {
                          ffptbb(in_stack_fffffffffffffd88,(LONGLONG)in_stack_fffffffffffffd80,
                                 (LONGLONG)in_stack_fffffffffffffd78,
                                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                                 (uchar *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
                          local_130 = local_130 + (long)&local_118->HDUposition;
                          local_118 = (fitsfile *)0x0;
                        }
                      }
                      local_128 = local_128 + 1;
                      in_stack_fffffffffffffd27 = *local_30 == 0 && (long)local_128 <= local_188;
                    } while ((bool)in_stack_fffffffffffffd27);
                    if (local_118 != (fitsfile *)0x0) {
                      ffptbb(in_stack_fffffffffffffd88,(LONGLONG)in_stack_fffffffffffffd80,
                             (LONGLONG)in_stack_fffffffffffffd78,
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                             (uchar *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
                      local_130 = local_130 + (long)&local_118->HDUposition;
                    }
                    if (in_RDI == in_RSI) {
                      if ((long)local_130 <= local_188) {
                        ffdrow((fitsfile *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                               (LONGLONG)in_stack_fffffffffffffd98,
                               (int *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
                        ;
                      }
                    }
                    else if ((local_180 != (fitsfile *)0x0) && (local_120 != 0)) {
                      if (*(int *)in_RSI != *(int *)(*(long *)(in_RSI + 8) + 0x54)) {
                        ffmahd(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                               &in_stack_fffffffffffffd68->HDUposition,in_stack_fffffffffffffd60);
                      }
                      lVar1 = *(long *)(*(long *)(in_RSI + 8) + 0x88);
                      lVar2 = *(long *)(*(long *)(in_RSI + 8) + 0x3d8);
                      local_150 = (long)&fptr_00->HDUposition + lVar2;
                      local_158 = ((local_150 + 0xb3f) / 0xb40) * 0xb40 - local_150;
                      local_138 = local_180;
                      if (local_158 - (long)local_180 < 0) {
                        local_138 = (fitsfile *)(((long)local_180 + (0xb3f - local_158)) / 0xb40);
                        ffiblk(in_stack_00001438,in_stack_00001430,in_stack_0000142c,
                               in_stack_00001420);
                      }
                      ffukyj(in_stack_fffffffffffffd18,(char *)keyname,(LONGLONG)values,
                             (char *)lParse_00,status_00);
                      if (*(int *)in_RDI != *(int *)(*(long *)(in_RDI + 8) + 0x54)) {
                        ffmahd(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                               &in_stack_fffffffffffffd68->HDUposition,in_stack_fffffffffffffd60);
                      }
                      local_178 = *(long *)(*(long *)(in_RDI + 8) + 0x88);
                      local_170 = *(long *)(*(long *)(in_RDI + 8) + 0x3d8);
                      local_138 = local_180;
                      local_140 = local_170 + local_178;
                      local_148 = (long)&fptr_00->HDUposition + lVar2 + lVar1;
                      while( true ) {
                        bVar8 = 0;
                        if (local_138 != (fitsfile *)0x0) {
                          bVar8 = *local_30 != 0 ^ 0xff;
                        }
                        if ((bVar8 & 1) == 0) break;
                        pfVar7 = local_138;
                        if (499999 < (long)local_138) {
                          pfVar7 = (fitsfile *)0x7a120;
                        }
                        local_108._48_8_ = pfVar7;
                        ffmbyt(pfVar7,(LONGLONG)keyname,(int)((ulong)values >> 0x20),
                               (int *)lParse_00);
                        ffgbyt(in_stack_fffffffffffffd58,(LONGLONG)in_stack_fffffffffffffd50,
                               in_stack_fffffffffffffd48,
                               (int *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))
                        ;
                        ffmbyt(pfVar7,(LONGLONG)keyname,(int)((ulong)values >> 0x20),
                               (int *)lParse_00);
                        ffpbyt(in_stack_fffffffffffffd68,(LONGLONG)in_stack_fffffffffffffd60,
                               in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
                        local_140 = (long)(int *)local_108._48_8_ + local_140;
                        local_148 = (long)(int *)local_108._48_8_ + local_148;
                        local_138 = (fitsfile *)((long)local_138 - local_108._48_8_);
                      }
                      if (fptr_00 != (fitsfile *)0x0) {
                        for (iVar5 = 1; iVar5 <= *(int *)(*(long *)(in_RSI + 8) + 0x3b0);
                            iVar5 = iVar5 + 1) {
                          pfVar7 = status_01;
                          if (*(int *)(*(long *)(*(long *)(in_RSI + 8) + 0x3d0) +
                                       (long)(iVar5 + -1) * 0xa0 + 0x50) < 0) {
                            while (pfVar7 = (fitsfile *)((long)&pfVar7->HDUposition + 1),
                                  (long)pfVar7 <= (long)&status_01->HDUposition + local_120) {
                              ffgdesll(pfVar7,iVar5,in_stack_fffffffffffffd38,(LONGLONG *)length,
                                       (LONGLONG *)fptr,
                                       (int *)CONCAT17(in_stack_fffffffffffffd27,
                                                       CONCAT16(bVar8,in_stack_fffffffffffffd20)));
                              ffpdes(pfVar7,iVar5,in_stack_fffffffffffffd38,(LONGLONG)length,
                                     (LONGLONG)fptr,
                                     (int *)CONCAT17(in_stack_fffffffffffffd27,
                                                     CONCAT16(bVar8,in_stack_fffffffffffffd20)));
                            }
                          }
                        }
                      }
                    }
                    if (local_160 == (void *)0x0) {
                      printf("invalid free(buffer) at %s:%d\n",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                             ,0x18d);
                    }
                    else {
                      free(local_160);
                    }
                  }
                  if (local_b8 == (void *)0x0) {
                    printf("invalid free(Info.dataPtr) at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                           ,400);
                  }
                  else {
                    free(local_b8);
                  }
                  ffcprs(lParse_00);
                  ffcmph(fptr_00,&status_01->HDUposition);
                  iVar5 = *local_30;
                }
              }
              else {
                ffpmsg((char *)0x12bb6a);
                ffcprs(lParse_00);
                *local_30 = 0x1b4;
                iVar5 = 0x1b4;
              }
            }
            else {
              ffcprs(lParse_00);
              iVar5 = *local_30;
            }
          }
        }
        else {
          ffcprs(lParse_00);
          iVar5 = *local_30;
        }
      }
      else {
        ffcprs(lParse_00);
        ffpmsg((char *)0x12b938);
        *local_30 = 0x1b0;
        iVar5 = 0x1b0;
      }
    }
    else {
      ffcprs(lParse_00);
      iVar5 = *local_30;
    }
  }
  else {
    iVar5 = *in_RCX;
  }
  return iVar5;
}

Assistant:

int ffsrow( fitsfile *infptr,   /* I - Input FITS file                      */
            fitsfile *outfptr,  /* I - Output FITS file                     */
            char     *expr,     /* I - Boolean expression                   */
            int      *status )  /* O - Error status                         */
/*                                                                          */
/* Evaluate an expression on all rows of a table.  If the input and output  */
/* files are not the same, copy the TRUE rows to the output file.  If the   */
/* files are the same, delete the FALSE rows (preserve the TRUE rows).      */
/* Can copy rows between extensions of the same file, *BUT* if output       */
/* extension is before the input extension, the second extension *MUST* be  */
/* opened using ffreopen, so that CFITSIO can handle changing file lengths. */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, rdlen, naxes[MAXDIMS], maxrows, nbuff, nGood, inloc, outloc;
   LONGLONG ntodo, inbyteloc, outbyteloc, hsize;
   long freespace;
   unsigned char *buffer, result;
   struct {
      LONGLONG rowLength, numRows, heapSize;
      LONGLONG dataStart, heapStart;
   } inExt, outExt;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   
   memset(&inExt, 0, sizeof(inExt));
   memset(&outExt, 0, sizeof(outExt));

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   /**********************************************************************/
   /* Make sure expression evaluates to the right type... logical scalar */
   /**********************************************************************/

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /***********************************************************/
   /*  Extract various table information from each extension  */
   /***********************************************************/

   if( infptr->HDUposition != (infptr->Fptr)->curhdu )
      ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   inExt.rowLength = (long) (infptr->Fptr)->rowlength;
   inExt.numRows   = (infptr->Fptr)->numrows;
   inExt.heapSize  = (infptr->Fptr)->heapsize;
   if( inExt.numRows == 0 ) { /* Nothing to copy */
      ffcprs(&lParse);
      return( *status );
   }

   if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
      ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
   if( (outfptr->Fptr)->datastart < 0 )
      ffrdef( outfptr, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   outExt.rowLength = (long) (outfptr->Fptr)->rowlength;
   outExt.numRows   = (outfptr->Fptr)->numrows;
   if( !outExt.numRows )
      (outfptr->Fptr)->heapsize = 0L;
   outExt.heapSize  = (outfptr->Fptr)->heapsize;

   if( inExt.rowLength != outExt.rowLength ) {
      ffpmsg("Output table has different row length from input");
      ffcprs(&lParse);
      return( *status = PARSE_BAD_OUTPUT );
   }

   /***********************************/
   /*  Fill out Info data for parser  */
   /***********************************/

   Info.dataPtr = (char *)malloc( (size_t) ((inExt.numRows + 1) * sizeof(char)) );
   Info.nullPtr = NULL;
   Info.maxRows = (long) inExt.numRows;
   Info.parseData = &lParse;
   if( !Info.dataPtr ) {
      ffpmsg("Unable to allocate memory for row selection");
      ffcprs(&lParse);
      return( *status = MEMORY_ALLOCATION );
   }
   
   /* make sure array is zero terminated */
   ((char*)Info.dataPtr)[inExt.numRows] = 0;

   if( constant ) { /*  Set all rows to the same value from constant result  */

      result = lParse.Nodes[lParse.resultNode].value.data.log;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         ((char*)Info.dataPtr)[ntodo] = result;
      nGood = (long) (result ? inExt.numRows : 0);

   } else {

      ffiter( lParse.nCols, lParse.colData, 0L, 0L,
              fits_parser_workfn, (void*)&Info, status );

      nGood = 0;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         if( ((char*)Info.dataPtr)[ntodo] ) nGood++;
   }

   if( *status ) {
      /* Error... Do nothing */
   } else {
      rdlen  = (long) inExt.rowLength;
      buffer = (unsigned char *)malloc(maxvalue(500000,rdlen) * sizeof(char) );
      if( buffer==NULL ) {
         ffcprs(&lParse);
         return( *status=MEMORY_ALLOCATION );
      }
      maxrows = maxvalue( (500000L/rdlen), 1);
      nbuff = 0;
      inloc = 1;
      if( infptr==outfptr ) { /* Skip initial good rows if input==output file */
         while( ((char*)Info.dataPtr)[inloc-1] ) inloc++;
         outloc = inloc;
      } else {
         outloc = (long) (outExt.numRows + 1);
         if (outloc > 1) 
            ffirow( outfptr, outExt.numRows, nGood, status );
      }

      do {
         if( ((char*)Info.dataPtr)[inloc-1] ) {
            ffgtbb( infptr, inloc, 1L, rdlen, buffer+rdlen*nbuff, status );
            nbuff++;
            if( nbuff==maxrows ) {
               ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
               outloc += nbuff;
               nbuff = 0;
            }
         }
         inloc++;
      } while( !*status && inloc<=inExt.numRows );

      if( nbuff ) {
         ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
         outloc += nbuff;
      }

      if( infptr==outfptr ) {

         if( outloc<=inExt.numRows )
            ffdrow( infptr, outloc, inExt.numRows-outloc+1, status );

      } else if( inExt.heapSize && nGood ) {

         /* Copy heap, if it exists and at least one row copied */

         /********************************************************/
         /*  Get location information from the output extension  */
         /********************************************************/

         if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
            ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
         outExt.dataStart = (outfptr->Fptr)->datastart;
         outExt.heapStart = (outfptr->Fptr)->heapstart;

         /*************************************************/
         /*  Insert more space into outfptr if necessary  */
         /*************************************************/

         hsize     = outExt.heapStart + outExt.heapSize;
         freespace = (long) (( ( (hsize + 2879) / 2880) * 2880) - hsize);
         ntodo     = inExt.heapSize;

         if ( (freespace - ntodo) < 0) {       /* not enough existing space? */
            ntodo = (ntodo - freespace + 2879) / 2880;  /* number of blocks  */
            ffiblk(outfptr, (long) ntodo, 1, status);   /* insert the blocks */
         }
         ffukyj( outfptr, "PCOUNT", inExt.heapSize+outExt.heapSize,
                 NULL, status );

         /*******************************************************/
         /*  Get location information from the input extension  */
         /*******************************************************/

         if( infptr->HDUposition != (infptr->Fptr)->curhdu )
            ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
         inExt.dataStart = (infptr->Fptr)->datastart;
         inExt.heapStart = (infptr->Fptr)->heapstart;

         /**********************************/
         /*  Finally copy heap to outfptr  */
         /**********************************/

         ntodo  =  inExt.heapSize;
         inbyteloc  =  inExt.heapStart +  inExt.dataStart;
         outbyteloc = outExt.heapStart + outExt.dataStart + outExt.heapSize;

         while ( ntodo && !*status ) {
            rdlen = (long) minvalue(ntodo,500000);
            ffmbyt( infptr,  inbyteloc,  REPORT_EOF, status );
            ffgbyt( infptr,  rdlen,  buffer,     status );
            ffmbyt( outfptr, outbyteloc, IGNORE_EOF, status );
            ffpbyt( outfptr, rdlen,  buffer,     status );
            inbyteloc  += rdlen;
            outbyteloc += rdlen;
            ntodo  -= rdlen;
         }

         /***********************************************************/
         /*  But must update DES if data is being appended to a     */
         /*  pre-existing heap space.  Edit each new entry in file  */
         /***********************************************************/

         if( outExt.heapSize ) {
            LONGLONG repeat, offset, j;
            int i;
            for( i=1; i<=(outfptr->Fptr)->tfield; i++ ) {
               if( (outfptr->Fptr)->tableptr[i-1].tdatatype<0 ) {
                  for( j=outExt.numRows+1; j<=outExt.numRows+nGood; j++ ) {
                     ffgdesll( outfptr, i, j, &repeat, &offset, status );
                     offset += outExt.heapSize;
                     ffpdes( outfptr, i, j, repeat, offset, status );
                  }
               }
            }
         }

      } /*  End of HEAP copy  */

      FREE(buffer);
   }

   FREE(Info.dataPtr);
   ffcprs(&lParse);

   ffcmph(outfptr, status);  /* compress heap, deleting any orphaned data */
   return(*status);
}